

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_read_at_all_end(MPIABI_File fh,void *buf,MPIABI_Status *status)

{
  MPIABI_Status *pMVar1;
  int iVar2;
  ompi_file_t *poVar3;
  MPI_Status *pMVar4;
  WPI_StatusPtr local_30;
  WPI_Handle local_28 [8];
  MPIABI_Status *local_20;
  MPIABI_Status *status_local;
  void *buf_local;
  MPIABI_File fh_local;
  
  local_20 = status;
  status_local = (MPIABI_Status *)buf;
  buf_local = (void *)fh;
  WPI_Handle<ompi_file_t_*>::WPI_Handle((WPI_Handle<ompi_file_t_*> *)local_28,fh);
  poVar3 = WPI_Handle::operator_cast_to_ompi_file_t_(local_28);
  pMVar1 = status_local;
  WPI_StatusPtr::WPI_StatusPtr(&local_30,local_20);
  pMVar4 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_30);
  iVar2 = MPI_File_read_at_all_end(poVar3,pMVar1,pMVar4);
  WPI_StatusPtr::~WPI_StatusPtr(&local_30);
  return iVar2;
}

Assistant:

int MPIABI_File_read_at_all_end(
  MPIABI_File fh,
  void * buf,
  MPIABI_Status * status
) {
  return MPI_File_read_at_all_end(
    (MPI_File)(WPI_File)fh,
    buf,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}